

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>
               (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                *req,send_lambda *send)

{
  verb vVar1;
  size_t sVar2;
  ulong uVar3;
  string_view query_00;
  RestCommand RVar4;
  int iVar5;
  void *pvVar6;
  pointer pcVar7;
  send_lambda *this;
  size_type __rlen;
  size_t __n_00;
  pointer pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type __n;
  pointer __n_01;
  long *__s1;
  char *pcVar9;
  string_view content_type;
  string_view body;
  string_view content_type_00;
  string_view content_type_01;
  string_view target;
  string_view content_type_02;
  string_view content_type_03;
  string_view content_type_04;
  string_view why;
  string_view why_00;
  string_view why_01;
  string_view target_00;
  anon_class_8_1_ba1d73fe response_ok;
  string brokerName;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  reqpr;
  anon_class_8_1_ba1d73fe bad_request;
  string targetObj;
  string query;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  anon_class_8_1_ba1d73fe not_found;
  RestCommand local_1b4;
  anon_class_8_1_ba1d73fe local_1b0;
  send_lambda *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [16];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  local_170;
  anon_class_8_1_ba1d73fe local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  response<http::string_body> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  anon_class_8_1_ba1d73fe local_68;
  string local_60;
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_38;
  
  if ((handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
       ::index_page_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                                   ::index_page_abi_cxx11_), iVar5 != 0)) {
    generateIndexPage_abi_cxx11_();
    __cxa_atexit(std::__cxx11::string::~string,
                 &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                  ::index_page_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                         ::index_page_abi_cxx11_);
  }
  vVar1 = (req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
          method_;
  local_1b0.req = req;
  local_158.req = req;
  local_68.req = req;
  switch(vVar1) {
  case delete_:
    local_1b4 = REMOVE;
    break;
  case get:
  case head:
  case search:
    local_1b4 = QUERY;
    break;
  case post:
  case put:
    local_1b4 = CREATE;
    break;
  default:
    why._M_str = "Unknown HTTP-method";
    why._M_len = 0x13;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_130,&local_158,why);
    HttpSession::send_lambda::operator()(send,&local_130);
    goto LAB_00220cac;
  case options:
    local_180._0_8_ = &local_170;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"{\"success\":true}","");
    content_type_00._M_str = "application/json";
    content_type_00._M_len = 0x10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_130,&local_1b0,(string *)local_180,content_type_00)
    ;
    HttpSession::send_lambda::operator()(send,&local_130);
    goto LAB_00220ff1;
  }
  sVar2 = (req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
          super_basic_fields<std::allocator<char>_>.target_or_reason_._M_len;
  __s1 = (long *)((req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                  ).super_basic_fields<std::allocator<char>_>.target_or_reason_._M_str +
                 (sVar2 != 0));
  __n_00 = 0;
  if (sVar2 != 0) {
    __n_00 = sVar2 - 1;
  }
  uVar3 = (req->
          super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
          ).value_._M_string_length;
  if ((long)__n_00 < 0xb) {
    if (__n_00 == 1) {
      iVar5 = bcmp(__s1,"/",1);
      if (uVar3 < 4 && iVar5 == 0) goto LAB_00220c79;
    }
    else if ((__n_00 == 10) && (iVar5 = bcmp(__s1,"index.html",10), iVar5 == 0)) {
LAB_00220c79:
      content_type._M_str = "text/html";
      content_type._M_len = 9;
      handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
      ::anon_class_8_1_ba1d73fe::operator()
                (&local_130,&local_1b0,
                 &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                  ::index_page_abi_cxx11_,content_type);
      HttpSession::send_lambda::operator()(send,&local_130);
LAB_00220cac:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.
             super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
             .value_._M_dataplus._M_p !=
          &local_130.
           super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
           .value_.field_2) {
        operator_delete(local_130.
                        super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                        .value_._M_dataplus._M_p,
                        local_130.
                        super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                        .value_.field_2._M_allocated_capacity + 1);
      }
      boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
                ((basic_fields<std::allocator<char>_> *)&local_130);
      return;
    }
  }
  else {
    if (__n_00 == 0xc) {
      pcVar9 = "/healthcheck";
    }
    else {
      if (__n_00 != 0xb) goto LAB_00220cf9;
      if (*(long *)((long)__s1 + 3) == 0x6c6d74682e786564 && *__s1 == 0x682e7865646e692f)
      goto LAB_00220c79;
      pcVar9 = "healthcheck";
    }
    iVar5 = bcmp(__s1,pcVar9,__n_00);
    if (iVar5 == 0) {
      local_180._0_8_ = &local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"{\"success\":true}","");
      content_type_01._M_str = "application/json";
      content_type_01._M_len = 0x10;
      handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
      ::anon_class_8_1_ba1d73fe::operator()
                (&local_130,&local_1b0,(string *)local_180,content_type_01);
      HttpSession::send_lambda::operator()(send,&local_130);
LAB_00220ff1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.
             super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
             .value_._M_dataplus._M_p !=
          &local_130.
           super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
           .value_.field_2) {
        operator_delete(local_130.
                        super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                        .value_._M_dataplus._M_p,
                        local_130.
                        super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                        .value_.field_2._M_allocated_capacity + 1);
      }
      boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
                ((basic_fields<std::allocator<char>_> *)&local_130);
      if ((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)local_180._0_8_ == &local_170) {
        return;
      }
      operator_delete((void *)local_180._0_8_,
                      (ulong)((long)local_170.m_flat_tree.m_data.m_seq.m_holder.m_start + 1));
      return;
    }
  }
LAB_00220cf9:
  body._M_str = (req->
                super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                ).value_._M_dataplus._M_p;
  body._M_len = uVar3;
  target_00._M_str = (char *)__s1;
  target_00._M_len = __n_00;
  local_1a8 = send;
  processRequestParameters_abi_cxx11_
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
              *)local_180,target_00,body);
  this = local_1a8;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  if ((pointer)local_180._0_8_ == (pointer)0x0) {
    __n_01 = (pointer)0x0;
LAB_00220ec7:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_1a0,0,0,(char *)local_180._8_8_,(size_type)__n_01);
  }
  else {
    __n_01 = (pointer)local_180._0_8_;
    if ((((char *)(local_180._8_8_ + -1))[local_180._0_8_] == '/') &&
       (__n_01 = (pointer)(local_180._0_8_ + -1), (pointer)(local_180._0_8_ + -1) == (pointer)0x0))
    {
LAB_00220ec4:
      __n_01 = (pointer)0x0;
      goto LAB_00220ec7;
    }
    pcVar9 = (char *)local_180._8_8_;
    if (*(char *)local_180._8_8_ == '/') {
      local_180._8_8_ = local_180._8_8_ + 1;
      __n_01 = __n_01 + -1;
      pcVar9 = (char *)local_180._8_8_;
      if (__n_01 == (pointer)0x0) goto LAB_00220ec4;
    }
    pvVar6 = memchr(pcVar9,0x2f,(size_t)__n_01);
    pcVar8 = (pointer)((long)pvVar6 - (long)pcVar9);
    local_180._8_8_ = pcVar9;
    if (pvVar6 == (void *)0x0 || pcVar8 == (pointer)0xffffffffffffffff) goto LAB_00220ec7;
    pcVar7 = pcVar8;
    if (__n_01 < pcVar8) {
      pcVar7 = __n_01;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_1a0,0,0,pcVar9,(size_type)pcVar7);
    pcVar7 = pcVar8 + 1;
    if (__n_01 <= pcVar8) {
LAB_0022131c:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 pcVar7,__n_01);
    }
    pcVar9 = pcVar9 + (long)pcVar7;
    this_00 = &local_150;
    __n_01 = __n_01 + -(long)pcVar7;
    if (__n_01 != (pointer)0x0) {
      pvVar6 = memchr(pcVar9,0x2f,(size_t)__n_01);
      pcVar8 = (pointer)((long)pvVar6 - (long)pcVar9);
      if (pcVar8 != (pointer)0xffffffffffffffff && pvVar6 != (void *)0x0) {
        pcVar7 = pcVar8;
        if (__n_01 < pcVar8) {
          pcVar7 = __n_01;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace(&local_150,0,local_150._M_string_length,pcVar9,(size_type)pcVar7);
        pcVar7 = pcVar8 + 1;
        if (__n_01 <= pcVar8) goto LAB_0022131c;
        __n_01 = __n_01 + -(long)pcVar7;
        pcVar9 = pcVar9 + (long)pcVar7;
        this_00 = &local_b0;
      }
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this_00,0,this_00->_M_string_length,pcVar9,(size_type)__n_01);
  }
  if (vVar1 == post) {
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_1a0,"delete");
    RVar4 = REMOVE;
    if ((iVar5 != 0) &&
       (iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&local_1a0,"remove"), iVar5 != 0)) {
      iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_1a0,"create");
      if (iVar5 == 0) {
        RVar4 = CREATE;
      }
      else {
        iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&local_1a0,"query");
        RVar4 = QUERY;
        if ((iVar5 != 0) &&
           (iVar5 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (&local_1a0,"search"), RVar4 = QUERY, iVar5 != 0)) {
          iVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (&local_1a0,"command");
          this = local_1a8;
          if (iVar5 != 0) goto LAB_0022105c;
          RVar4 = COMMAND;
        }
      }
    }
    local_1b4 = RVar4;
    local_1a0._M_string_length = 0;
    *local_1a0._M_dataplus._M_p = '\0';
    this = local_1a8;
  }
LAB_0022105c:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_1a0._M_dataplus._M_p,
             local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
  local_40 = local_b0._M_string_length;
  paStack_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b0._M_dataplus._M_p;
  query_00._M_str = local_b0._M_dataplus._M_p;
  query_00._M_len = local_b0._M_string_length;
  target._M_str = local_150._M_dataplus._M_p;
  target._M_len = local_150._M_string_length;
  generateResults(&local_90,local_1b4,&local_60,target,query_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_90.first == BAD_REQUEST) {
    why_01._M_str = local_90.second._M_dataplus._M_p;
    why_01._M_len = local_90.second._M_string_length;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_130,&local_158,why_01);
    HttpSession::send_lambda::operator()(this,&local_130);
  }
  else if (local_90.first == NOT_FOUND) {
    why_00._M_str = local_90.second._M_dataplus._M_p;
    why_00._M_len = local_90.second._M_string_length;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_130,&local_68,why_00);
    HttpSession::send_lambda::operator()(this,&local_130);
  }
  else if (local_90.second._M_string_length == 0) {
    content_type_03._M_str = "text/html";
    content_type_03._M_len = 9;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()
              (&local_130,&local_1b0,
               &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,content_type_03);
    HttpSession::send_lambda::operator()(this,&local_130);
  }
  else if (*local_90.second._M_dataplus._M_p == '{') {
    content_type_02._M_str = "application/json";
    content_type_02._M_len = 0x10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_130,&local_1b0,&local_90.second,content_type_02);
    HttpSession::send_lambda::operator()(this,&local_130);
  }
  else {
    content_type_04._M_str = "text/plain";
    content_type_04._M_len = 10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_130,&local_1b0,&local_90.second,content_type_04);
    HttpSession::send_lambda::operator()(this,&local_130);
  }
  boost::beast::http::
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message(&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.second._M_dataplus._M_p != &local_90.second.field_2) {
    operator_delete(local_90.second._M_dataplus._M_p,
                    local_90.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,
                    CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                             local_1a0.field_2._M_local_buf[0]) + 1);
  }
  boost::container::
  vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
  ::~vector((vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
             *)&local_170);
  return;
}

Assistant:

void handle_request(http::request<Body, http::basic_fields<Allocator>>&& req, Send&& send)
{
    static const std::string index_page = generateIndexPage();
    // Returns a bad request response
    auto const bad_request = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::bad_request, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // Returns a bad request response
    auto const not_found = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::not_found, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // generate a conversion response
    auto const response_ok = [&req](const std::string& resp, std::string_view content_type) {
        http::response<http::string_body> res{http::status::ok, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, content_type);
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");
        res.set(http::field::access_control_allow_methods, "*");
        res.set(http::field::access_control_allow_headers, "*");

        if (req.method() != http::verb::head) {
            res.body() = resp;
            res.prepare_payload();
        } else {
            res.set(http::field::content_length, std::to_string(resp.size()));
        }
        return res;
    };

    RestCommand command{RestCommand::QUERY};

    auto method = req.method();
    switch (method) {
        case http::verb::head:
        case http::verb::search:
        case http::verb::get:
            break;
        case http::verb::post:
        case http::verb::put:
            command = RestCommand::CREATE;
            break;
        case http::verb::delete_:
            command = RestCommand::REMOVE;
            break;
        case http::verb::options:
            return send(response_ok("{\"success\":true}", "application/json"));
        default:
            return send(bad_request("Unknown HTTP-method"));
    }

    const std::string_view target(req.target());
    auto psize = req.payload_size();
    if (target == "/index.html" || target == "index.html" ||
        (target == "/" && (!psize || *psize < 4))) {
        return send(response_ok(index_page, "text/html"));
    }

    if (target == "/healthcheck" || target == "healthcheck") {
        return send(response_ok("{\"success\":true}", "application/json"));
    }

    auto reqpr = processRequestParameters(target, req.body());
    std::string brokerName;
    std::string query;
    std::string targetObj;

    partitionTarget(reqpr.first, brokerName, query, targetObj);

    if (method == http::verb::post) {
        if (brokerName == "delete" || brokerName == "remove") {
            command = RestCommand::REMOVE;
            brokerName.clear();
        } else if (brokerName == "create") {
            command = RestCommand::CREATE;
            brokerName.clear();
        } else if (brokerName == "query" || brokerName == "search") {
            command = RestCommand::QUERY;
            brokerName.clear();
        } else if (brokerName == "command") {
            command = RestCommand::COMMAND;
            brokerName.clear();
        }
    }
    auto res = generateResults(command, brokerName, targetObj, query, reqpr.second);
    switch (res.first) {
        case RequestReturnVal::BAD_REQUEST:
            return send(bad_request(res.second));
        case RequestReturnVal::NOT_FOUND:
            return send(not_found(res.second));
        case RequestReturnVal::OK:
        default:
            if (res.second.empty()) {
                return send(response_ok(index_page, "text/html"));
            }
            if (res.second.front() == '{') {
                return send(response_ok(res.second, "application/json"));
            }
            return send(response_ok(res.second, "text/plain"));
    }
}